

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecInt.h
# Opt level: O3

int Vec_IntPushUnique(Vec_Int_t *p,int Entry)

{
  size_t __size;
  uint uVar1;
  int iVar2;
  int *piVar3;
  ulong uVar4;
  
  uVar1 = p->nSize;
  if (0 < (int)uVar1) {
    piVar3 = p->pArray;
    uVar4 = 0;
    do {
      if (piVar3[uVar4] == Entry) goto LAB_004d0462;
      uVar4 = uVar4 + 1;
    } while (uVar1 != uVar4);
  }
  if (uVar1 == p->nCap) {
    if ((int)uVar1 < 0x10) {
      if (p->pArray == (int *)0x0) {
        piVar3 = (int *)malloc(0x40);
      }
      else {
        piVar3 = (int *)realloc(p->pArray,0x40);
      }
      p->pArray = piVar3;
      if (piVar3 == (int *)0x0) {
LAB_004d0468:
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      p->nCap = 0x10;
    }
    else {
      __size = (ulong)uVar1 * 8;
      if (p->pArray == (int *)0x0) {
        piVar3 = (int *)malloc(__size);
      }
      else {
        piVar3 = (int *)realloc(p->pArray,__size);
      }
      p->pArray = piVar3;
      if (piVar3 == (int *)0x0) goto LAB_004d0468;
      p->nCap = uVar1 * 2;
    }
  }
  else {
    piVar3 = p->pArray;
  }
  iVar2 = p->nSize;
  p->nSize = iVar2 + 1;
  piVar3[iVar2] = Entry;
LAB_004d0462:
  return (int)piVar3;
}

Assistant:

static inline int Vec_IntPushUnique( Vec_Int_t * p, int Entry )
{
    int i;
    for ( i = 0; i < p->nSize; i++ )
        if ( p->pArray[i] == Entry )
            return 1;
    Vec_IntPush( p, Entry );
    return 0;
}